

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

pair<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_bool>
* __thiscall
pstore::json::details::root_matcher<callbacks_proxy<mock_json_callbacks>_>::consume
          (pair<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_bool>
           *__return_storage_ptr__,root_matcher<callbacks_proxy<mock_json_callbacks>_> *this,
          parser<callbacks_proxy<mock_json_callbacks>_> *parser,maybe<char,_void> *ch)

{
  byte bVar1;
  int iVar2;
  _Head_base<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_false>
  _Var3;
  char *pcVar4;
  byte *pbVar5;
  matcher<callbacks_proxy<mock_json_callbacks>_> *pmVar6;
  undefined **ppuVar7;
  error_code local_38;
  string *local_28;
  
  if (ch->valid_ == false) {
LAB_0012c029:
    local_38._M_cat = get_error_category();
    local_38._M_value = 8;
    matcher<callbacks_proxy<mock_json_callbacks>_>::set_error
              (&this->super_matcher<callbacks_proxy<mock_json_callbacks>_>,parser,&local_38);
    *(undefined8 *)
     &(__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
         = 1;
    (__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
    .
    super__Head_base<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_false>
    ._M_head_impl = (matcher<callbacks_proxy<mock_json_callbacks>_> *)0x0;
    __return_storage_ptr__->second = true;
    return __return_storage_ptr__;
  }
  iVar2 = (this->super_matcher<callbacks_proxy<mock_json_callbacks>_>).state_;
  if (iVar2 == 2) {
    (this->super_matcher<callbacks_proxy<mock_json_callbacks>_>).state_ = 3;
    _Var3._M_head_impl =
         (parser->singletons_)._M_t.
         super___uniq_ptr_impl<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
         .
         super__Head_base<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_false>
         ._M_head_impl;
    *(undefined4 *)((long)&(_Var3._M_head_impl)->terminal + 8) = 2;
    ((_Var3._M_head_impl)->terminal).__align =
         (anon_struct_8_0_00000001_for___align)&PTR__matcher_001a9498;
    local_38._M_value = local_38._M_value & 0xffffff00;
    (__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
    .
    super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
    .
    super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>,_false>
         = (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>,_false>
            )0x0;
    (__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
    .
    super__Head_base<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_false>
    ._M_head_impl =
         (matcher<callbacks_proxy<mock_json_callbacks>_> *)&(_Var3._M_head_impl)->terminal;
    __return_storage_ptr__->second = false;
    goto LAB_0012bfeb;
  }
  if (iVar2 != 3) {
    if (iVar2 != 1) {
      assert_failed("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                    ,0x698);
    }
    assert_failed("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                  ,0x696);
  }
  if (((this->super_matcher<callbacks_proxy<mock_json_callbacks>_>).field_0xc == '\x01') &&
     (pcVar4 = maybe<char,_void>::operator->(ch), *pcVar4 != '\"')) {
    local_38._M_cat = get_error_category();
    local_38._M_value = 5;
    matcher<callbacks_proxy<mock_json_callbacks>_>::set_error
              (&this->super_matcher<callbacks_proxy<mock_json_callbacks>_>,parser,&local_38);
  }
  (this->super_matcher<callbacks_proxy<mock_json_callbacks>_>).state_ = 1;
  pbVar5 = (byte *)maybe<char,_void>::operator->(ch);
  bVar1 = *pbVar5;
  if (bVar1 - 0x30 < 10) {
LAB_0012bf86:
    matcher<callbacks_proxy<mock_json_callbacks>>::
    make_terminal_matcher<pstore::json::details::number_matcher<callbacks_proxy<mock_json_callbacks>>>
              ((matcher<callbacks_proxy<mock_json_callbacks>> *)&local_38,
               (parser<callbacks_proxy<mock_json_callbacks>_> *)this);
  }
  else {
    if (bVar1 != 0x22) {
      if (bVar1 == 0x7b) {
        pmVar6 = (matcher<callbacks_proxy<mock_json_callbacks>_> *)operator_new(0x10);
        pmVar6->state_ = 2;
        ppuVar7 = &PTR__matcher_001a9698;
      }
      else {
        if (bVar1 != 0x5b) {
          if (bVar1 == 0x66) {
            matcher<callbacks_proxy<mock_json_callbacks>>::
            make_terminal_matcher<pstore::json::details::token_matcher<callbacks_proxy<mock_json_callbacks>,pstore::json::details::false_complete>,char_const(&)[6]>
                      ((matcher<callbacks_proxy<mock_json_callbacks>> *)&local_38,
                       (parser<callbacks_proxy<mock_json_callbacks>_> *)this,(char (*) [6])parser);
          }
          else if (bVar1 == 0x6e) {
            matcher<callbacks_proxy<mock_json_callbacks>>::
            make_terminal_matcher<pstore::json::details::token_matcher<callbacks_proxy<mock_json_callbacks>,pstore::json::details::null_complete>,char_const(&)[5]>
                      ((matcher<callbacks_proxy<mock_json_callbacks>> *)&local_38,
                       (parser<callbacks_proxy<mock_json_callbacks>_> *)this,(char (*) [5])parser);
          }
          else {
            if (bVar1 != 0x74) {
              if (bVar1 != 0x2d) goto LAB_0012c029;
              goto LAB_0012bf86;
            }
            matcher<callbacks_proxy<mock_json_callbacks>>::
            make_terminal_matcher<pstore::json::details::token_matcher<callbacks_proxy<mock_json_callbacks>,pstore::json::details::true_complete>,char_const(&)[5]>
                      ((matcher<callbacks_proxy<mock_json_callbacks>> *)&local_38,
                       (parser<callbacks_proxy<mock_json_callbacks>_> *)this,(char (*) [5])parser);
          }
          goto LAB_0012bf97;
        }
        pmVar6 = (matcher<callbacks_proxy<mock_json_callbacks>_> *)operator_new(0x10);
        pmVar6->state_ = 2;
        ppuVar7 = &PTR__matcher_001a9658;
      }
      pmVar6->_vptr_matcher = (_func_int **)ppuVar7;
      local_38._M_value = CONCAT31(local_38._M_value._1_3_,1);
      (__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
      .
      super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
      .
      super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>,_false>
           = (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>,_false>
              )0x1;
      (__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
      .
      super__Head_base<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_false>
      ._M_head_impl = pmVar6;
      __return_storage_ptr__->second = false;
      goto LAB_0012bfeb;
    }
    local_28 = &parser->string_;
    matcher<callbacks_proxy<mock_json_callbacks>>::
    make_terminal_matcher<pstore::json::details::string_matcher<callbacks_proxy<mock_json_callbacks>>,std::__cxx11::string*,bool_const&>
              ((matcher<callbacks_proxy<mock_json_callbacks>> *)&local_38,
               (parser<callbacks_proxy<mock_json_callbacks>_> *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)parser,
               (bool *)&local_28);
  }
LAB_0012bf97:
  (__return_storage_ptr__->first)._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
  .
  super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
  .
  super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>,_false>
       = local_38._M_value._0_1_;
  (__return_storage_ptr__->first)._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_false>
  ._M_head_impl = (matcher<callbacks_proxy<mock_json_callbacks>_> *)local_38._M_cat;
  __return_storage_ptr__->second = false;
LAB_0012bfeb:
  local_38._M_cat = (error_category *)0x0;
  std::
  unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
  ::~unique_ptr((unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
                 *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::pair<typename matcher<Callbacks>::pointer, bool>
            root_matcher<Callbacks>::consume (parser<Callbacks> & parser, maybe<char> ch) {
                if (!ch) {
                    this->set_error (parser, error_code::expected_token);
                    return {nullptr, true};
                }

                switch (this->get_state ()) {
                case start_state:
                    this->set_state (new_token_state);
                    return {this->make_whitespace_matcher (parser), false};

                case new_token_state: {
                    if (object_key_ && *ch != '"') {
                        this->set_error (parser, error_code::expected_string);
                        // Don't return here in order to allow the switch default to produce a
                        // different error code for a bad token.
                    }
                    this->set_state (done_state);
                    switch (*ch) {
                    case '-':
                    case '0':
                    case '1':
                    case '2':
                    case '3':
                    case '4':
                    case '5':
                    case '6':
                    case '7':
                    case '8':
                    case '9':
                        return {this->template make_terminal_matcher<number_matcher<Callbacks>> (
                                    parser),
                                false};
                    case '"':
                        return {this->template make_terminal_matcher<string_matcher<Callbacks>> (
                                    parser, &parser.string_, object_key_),
                                false};
                    case 't':
                        return {
                            this->template make_terminal_matcher<true_token_matcher<Callbacks>> (
                                parser, "true"),
                            false};
                    case 'f':
                        return {
                            this->template make_terminal_matcher<false_token_matcher<Callbacks>> (
                                parser, "false"),
                            false};
                    case 'n':
                        return {
                            this->template make_terminal_matcher<null_token_matcher<Callbacks>> (
                                parser, "null"),
                            false};
                    case '[':
                        return {
                            typename matcher<Callbacks>::pointer (new array_matcher<Callbacks> ()),
                            false};
                    case '{':
                        return {
                            typename matcher<Callbacks>::pointer (new object_matcher<Callbacks> ()),
                            false};
                    default:
                        this->set_error (parser, error_code::expected_token);
                        return {nullptr, true};
                    }
                } break;
                case done_state: PSTORE_ASSERT (false); break;
                }
                PSTORE_ASSERT (false); // unreachable.
                return {nullptr, true};
            }